

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O2

JL_STATUS JlMarshallFromStructToNewDataObject
                    (void *Structure,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,JlDataObject **pDictionaryObject)

{
  JL_STATUS JVar1;
  JlDataObject *newDictionaryObject;
  
  if ((pDictionaryObject == (JlDataObject **)0x0 || StructDescriptionCount == 0) ||
      (StructDescription == (JlMarshallElement *)0x0 || Structure == (void *)0x0)) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    newDictionaryObject = (JlDataObject *)0x0;
    *pDictionaryObject = (JlDataObject *)0x0;
    JVar1 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,&newDictionaryObject);
    if (JVar1 == JL_STATUS_SUCCESS) {
      JVar1 = JlMarshallFromStructToDataObject
                        (Structure,StructDescription,StructDescriptionCount,newDictionaryObject);
      if (JVar1 == JL_STATUS_SUCCESS) {
        *pDictionaryObject = newDictionaryObject;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JlFreeObjectTree(&newDictionaryObject);
      }
    }
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlMarshallFromStructToNewDataObject
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject**              pDictionaryObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != Structure
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != pDictionaryObject )
    {
        JlDataObject* newDictionaryObject = NULL;
        *pDictionaryObject = NULL;

        jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, &newDictionaryObject );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            jlStatus = JlMarshallFromStructToDataObject( Structure, StructDescription, StructDescriptionCount, newDictionaryObject );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pDictionaryObject = newDictionaryObject;
            }
            else
            {
                JlFreeObjectTree( &newDictionaryObject );
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}